

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

char * kvtree_get_val(kvtree *hash,char *key)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem *first;
  kvtree_elem *pkVar2;
  kvtree_elem_struct *pkVar3;
  uint uVar4;
  ulong uVar5;
  
  pkVar2 = kvtree_elem_get(hash,key);
  if (pkVar2 != (kvtree_elem *)0x0) {
    uVar5 = 0;
    if (pkVar2->hash != (kvtree_struct *)0x0) {
      pkVar1 = pkVar2->hash->lh_first;
      if (pkVar1 != (kvtree_elem_struct *)0x0) {
        uVar5 = 0;
        pkVar3 = pkVar1;
        do {
          uVar4 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar4;
          pkVar3 = (pkVar3->pointers).le_next;
        } while (pkVar3 != (kvtree_elem_struct *)0x0);
        if (uVar4 == 1) {
          return pkVar1->key;
        }
      }
      kvtree_err("Hash for key %s expected to have exactly one element, but it has %d @ %s:%d",key,
                 uVar5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                 ,0x3ac);
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

char* kvtree_get_val(const kvtree* hash, const char* key)
{
  char* value = NULL;

  /* check whether the specified key is even set */
  kvtree* key_hash = kvtree_get(hash, key);
  if (key_hash != NULL) {
    /* check that the size of this hash belonging to the key is
     * exactly 1 */
    int size = kvtree_size(key_hash);
    if (size == 1) {
      /* get the key of the first element in this hash */
      kvtree_elem* first = kvtree_elem_first(key_hash);
      value = kvtree_elem_key(first);
    } else {
      /* this is an error */
      kvtree_err("Hash for key %s expected to have exactly one element, but it has %d @ %s:%d",
        key, size, __FILE__, __LINE__
      );
    }
  }

  return value;
}